

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O0

void __thiscall EventDispatcher::EventDispatcher(EventDispatcher *this)

{
  EventDispatcher *this_local;
  
  IEventDispatcher::IEventDispatcher(&this->super_IEventDispatcher);
  (this->super_IEventDispatcher)._vptr_IEventDispatcher = (_func_int **)&PTR_sendEventSync_00146f50;
  EventQueue::EventQueue(&this->mQueue);
  EventDispatcherHelper::EventDispatcherHelper(&this->mDispatcher);
  Condition::Condition(&this->mSyncWait);
  Mutex::Mutex(&this->mSyncLock,false);
  return;
}

Assistant:

EventDispatcher::EventDispatcher()
{
	// NOTE:  This is a sort of hacky way of preventing a bad condition from
	// occuring.  It was found that when we are processing a signal to do
	// a shutdown (ie.  ctrl-c in tad) the creation of the thread in the
	// TimerManager hangs the system.  I traced this down to a hang up in
	// a call to pthread_create.  The odd thing is that the new thread is
	// spawned (the main is run) but the pthread_create method never returns.
	// To prevent this from hanging us up in the future we will make sure
	// that the TimerManager is initialized when an EventDispatcher is
	// created.
//	TimerManager::getInstance();
}